

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

int calc_avg_stats(AV1_COMP *cpi,FIRSTPASS_STATS *avg_frame_stat)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  int num_frames;
  FIRSTPASS_STATS cur_frame;
  TWO_PASS *twopass;
  RATE_CONTROL *rc;
  undefined4 in_stack_fffffffffffffee8;
  int iVar2;
  FIRSTPASS_STATS *in_stack_fffffffffffffef0;
  TWO_PASS *in_stack_fffffffffffffef8;
  
  memset(&stack0xfffffffffffffef0,0,0xe8);
  iVar2 = 0;
  while ((iVar2 < *(int *)(in_RDI + 0x6079c) + -1 &&
         (iVar1 = input_stats(in_stack_fffffffffffffef8,(TWO_PASS_FRAME *)in_stack_fffffffffffffef0,
                              (FIRSTPASS_STATS *)CONCAT44(iVar2,in_stack_fffffffffffffee8)),
         iVar1 != -1))) {
    av1_accumulate_stats
              (in_stack_fffffffffffffef0,
               (FIRSTPASS_STATS *)CONCAT44(iVar2,in_stack_fffffffffffffee8));
    iVar2 = iVar2 + 1;
  }
  if (1 < iVar2) {
    *(double *)(in_RSI + 8) = *(double *)(in_RSI + 8) / (double)iVar2;
    *(double *)(in_RSI + 0x10) = *(double *)(in_RSI + 0x10) / (double)iVar2;
    *(double *)(in_RSI + 0x18) = *(double *)(in_RSI + 0x18) / (double)iVar2;
    *(double *)(in_RSI + 0x20) = *(double *)(in_RSI + 0x20) / (double)iVar2;
    *(double *)(in_RSI + 0x28) = *(double *)(in_RSI + 0x28) / (double)iVar2;
    *(double *)(in_RSI + 0x30) = *(double *)(in_RSI + 0x30) / (double)iVar2;
    *(double *)(in_RSI + 0x38) = *(double *)(in_RSI + 0x38) / (double)iVar2;
    *(double *)(in_RSI + 0x40) = *(double *)(in_RSI + 0x40) / (double)iVar2;
    *(double *)(in_RSI + 0x48) = *(double *)(in_RSI + 0x48) / (double)iVar2;
    *(double *)(in_RSI + 0x50) = *(double *)(in_RSI + 0x50) / (double)iVar2;
    *(double *)(in_RSI + 0x58) = *(double *)(in_RSI + 0x58) / (double)iVar2;
    *(double *)(in_RSI + 0x60) = *(double *)(in_RSI + 0x60) / (double)iVar2;
    *(double *)(in_RSI + 0x68) = *(double *)(in_RSI + 0x68) / (double)iVar2;
    *(double *)(in_RSI + 0x70) = *(double *)(in_RSI + 0x70) / (double)iVar2;
    *(double *)(in_RSI + 0x78) = *(double *)(in_RSI + 0x78) / (double)iVar2;
    *(double *)(in_RSI + 0x80) = *(double *)(in_RSI + 0x80) / (double)iVar2;
    *(double *)(in_RSI + 0x88) = *(double *)(in_RSI + 0x88) / (double)iVar2;
    *(double *)(in_RSI + 0x90) = *(double *)(in_RSI + 0x90) / (double)iVar2;
    *(double *)(in_RSI + 0x98) = *(double *)(in_RSI + 0x98) / (double)iVar2;
    *(double *)(in_RSI + 0xa0) = *(double *)(in_RSI + 0xa0) / (double)iVar2;
    *(double *)(in_RSI + 0xb0) = *(double *)(in_RSI + 0xb0) / (double)iVar2;
    *(double *)(in_RSI + 0xa8) = *(double *)(in_RSI + 0xa8) / (double)iVar2;
  }
  return iVar2;
}

Assistant:

static int calc_avg_stats(AV1_COMP *cpi, FIRSTPASS_STATS *avg_frame_stat) {
  RATE_CONTROL *const rc = &cpi->rc;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  FIRSTPASS_STATS cur_frame;
  av1_zero(cur_frame);
  int num_frames = 0;
  // Accumulate total stat using available number of stats.
  for (num_frames = 0; num_frames < (rc->frames_to_key - 1); ++num_frames) {
    if (EOF == input_stats(twopass, &cpi->twopass_frame, &cur_frame)) break;
    av1_accumulate_stats(avg_frame_stat, &cur_frame);
  }

  if (num_frames < 2) {
    return num_frames;
  }
  // Average the total stat
  avg_frame_stat->weight = avg_frame_stat->weight / num_frames;
  avg_frame_stat->intra_error = avg_frame_stat->intra_error / num_frames;
  avg_frame_stat->frame_avg_wavelet_energy =
      avg_frame_stat->frame_avg_wavelet_energy / num_frames;
  avg_frame_stat->coded_error = avg_frame_stat->coded_error / num_frames;
  avg_frame_stat->sr_coded_error = avg_frame_stat->sr_coded_error / num_frames;
  avg_frame_stat->pcnt_inter = avg_frame_stat->pcnt_inter / num_frames;
  avg_frame_stat->pcnt_motion = avg_frame_stat->pcnt_motion / num_frames;
  avg_frame_stat->pcnt_second_ref =
      avg_frame_stat->pcnt_second_ref / num_frames;
  avg_frame_stat->pcnt_neutral = avg_frame_stat->pcnt_neutral / num_frames;
  avg_frame_stat->intra_skip_pct = avg_frame_stat->intra_skip_pct / num_frames;
  avg_frame_stat->inactive_zone_rows =
      avg_frame_stat->inactive_zone_rows / num_frames;
  avg_frame_stat->inactive_zone_cols =
      avg_frame_stat->inactive_zone_cols / num_frames;
  avg_frame_stat->MVr = avg_frame_stat->MVr / num_frames;
  avg_frame_stat->mvr_abs = avg_frame_stat->mvr_abs / num_frames;
  avg_frame_stat->MVc = avg_frame_stat->MVc / num_frames;
  avg_frame_stat->mvc_abs = avg_frame_stat->mvc_abs / num_frames;
  avg_frame_stat->MVrv = avg_frame_stat->MVrv / num_frames;
  avg_frame_stat->MVcv = avg_frame_stat->MVcv / num_frames;
  avg_frame_stat->mv_in_out_count =
      avg_frame_stat->mv_in_out_count / num_frames;
  avg_frame_stat->new_mv_count = avg_frame_stat->new_mv_count / num_frames;
  avg_frame_stat->count = avg_frame_stat->count / num_frames;
  avg_frame_stat->duration = avg_frame_stat->duration / num_frames;

  return num_frames;
}